

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::optional<dap::Source>_>::construct
          (BasicTypeInfo<dap::optional<dap::Source>_> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::optional<dap::Source>_> *this_local;
  
  memset(ptr,0,0x138);
  optional<dap::Source>::optional((optional<dap::Source> *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }